

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdGetConfidentialTxOutIndex
              (void *handle,char *tx_hex_string,char *address,char *direct_locking_script,
              uint32_t *index)

{
  bool bVar1;
  CfdException *pCVar2;
  string addr_str;
  ElementsAddressFactory address_factory;
  Address addr;
  ConfidentialTransactionContext tx;
  string local_5d0;
  AddressFactory local_5b0;
  undefined1 local_588 [32];
  undefined1 local_568 [16];
  pointer local_558;
  pointer local_540;
  pointer local_528;
  TapBranch local_510;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_498;
  Script local_480;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_440 [2];
  undefined1 local_3d8 [32];
  undefined1 local_3b8 [16];
  pointer local_3a8;
  pointer local_390;
  pointer local_378;
  TapBranch local_360;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_2e8;
  Script local_2d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_290;
  ConfidentialTransactionContext local_260;
  Address local_1a8;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    local_588._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_588._8_4_ = 0x38a;
    local_588._16_8_ = "CfdGetConfidentialTxOutIndex";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_588,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_588._0_8_ = local_588 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_588,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_588);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)local_588,tx_hex_string,(allocator *)local_3d8);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (&local_260,(string *)local_588);
  if ((undefined1 *)local_588._0_8_ != local_588 + 0x10) {
    operator_delete((void *)local_588._0_8_);
  }
  bVar1 = cfd::capi::IsEmptyString(direct_locking_script);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(address);
    if (bVar1) {
      bVar1 = cfd::ConfidentialTransactionContext::IsFindFeeTxOut(&local_260,index);
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&local_5b0);
      std::__cxx11::string::string((string *)&local_5d0,address,(allocator *)local_588);
      cfd::core::Address::Address((Address *)local_3d8);
      bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_5d0);
      if (bVar1) {
        cfd::ElementsAddressFactory::GetConfidentialAddress
                  ((ElementsConfidentialAddress *)local_588,(ElementsAddressFactory *)&local_5b0,
                   &local_5d0);
        cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
                  (&local_1a8,(ElementsConfidentialAddress *)local_588);
        cfd::core::Address::operator=((Address *)local_3d8,&local_1a8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_1a8.format_data_);
        cfd::core::Script::~Script(&local_1a8.redeem_script_);
        local_1a8.script_tree_.super_TapBranch._vptr_TapBranch =
             (_func_int **)&PTR__TaprootScriptTree_00740b18;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_1a8.script_tree_.nodes_);
        cfd::core::TapBranch::~TapBranch(&local_1a8.script_tree_.super_TapBranch);
        if (local_1a8.schnorr_pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a8.schnorr_pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1a8.pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a8.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a8.hash_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.address_._M_dataplus._M_p != &local_1a8.address_.field_2) {
          operator_delete(local_1a8.address_._M_dataplus._M_p);
        }
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)local_588);
      }
      else {
        cfd::AddressFactory::GetAddress((Address *)local_588,&local_5b0,&local_5d0);
        cfd::core::Address::operator=((Address *)local_3d8,(Address *)local_588);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_440);
        cfd::core::Script::~Script(&local_480);
        local_510._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_498);
        cfd::core::TapBranch::~TapBranch(&local_510);
        if (local_528 != (pointer)0x0) {
          operator_delete(local_528);
        }
        if (local_540 != (pointer)0x0) {
          operator_delete(local_540);
        }
        if (local_558 != (pointer)0x0) {
          operator_delete(local_558);
        }
        if ((undefined1 *)local_588._16_8_ != local_568) {
          operator_delete((void *)local_588._16_8_);
        }
      }
      bVar1 = cfd::ConfidentialTransactionContext::IsFindTxOut
                        (&local_260,(Address *)local_3d8,index,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_290);
      cfd::core::Script::~Script(&local_2d0);
      local_360._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_2e8);
      cfd::core::TapBranch::~TapBranch(&local_360);
      if (local_378 != (pointer)0x0) {
        operator_delete(local_378);
      }
      if (local_390 != (pointer)0x0) {
        operator_delete(local_390);
      }
      if (local_3a8 != (pointer)0x0) {
        operator_delete(local_3a8);
      }
      if ((undefined1 *)local_3d8._16_8_ != local_3b8) {
        operator_delete((void *)local_3d8._16_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
        operator_delete(local_5d0._M_dataplus._M_p);
      }
      local_5b0._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_5b0.prefix_list_);
    }
  }
  else {
    std::__cxx11::string::string((string *)local_3d8,direct_locking_script,(allocator *)&local_1a8);
    cfd::core::Script::Script((Script *)local_588,(string *)local_3d8);
    bVar1 = cfd::ConfidentialTransactionContext::IsFindTxOut
                      (&local_260,(Script *)local_588,index,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
    cfd::core::Script::~Script((Script *)local_588);
    if ((undefined1 *)local_3d8._0_8_ != local_3d8 + 0x10) {
      operator_delete((void *)local_3d8._0_8_);
    }
  }
  if (bVar1 != false) {
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_260);
    return 0;
  }
  local_588._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_588._8_4_ = 0x3a5;
  local_588._16_8_ = "CfdGetConfidentialTxOutIndex";
  cfd::core::logger::log<>((CfdSourceLocation *)local_588,kCfdLogLevelWarning,"target not found.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_588._0_8_ = local_588 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_588,"Failed to parameter. search target is not found.","");
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_588);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxOutIndex(
    void* handle, const char* tx_hex_string, const char* address,
    const char* direct_locking_script, uint32_t* index) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionContext tx(tx_hex_string);
    bool is_find = false;

    if (!IsEmptyString(direct_locking_script)) {
      is_find = tx.IsFindTxOut(Script(direct_locking_script), index);
    } else if (!IsEmptyString(address)) {
      ElementsAddressFactory address_factory;
      std::string addr_str(address);
      Address addr;
      if (ElementsConfidentialAddress::IsConfidentialAddress(addr_str)) {
        addr = address_factory.GetConfidentialAddress(addr_str)
                   .GetUnblindedAddress();
      } else {
        addr = address_factory.GetAddress(addr_str);
      }
      is_find = tx.IsFindTxOut(addr, index);
    } else {
      // fee
      is_find = tx.IsFindFeeTxOut(index);
    }
    if (!is_find) {
      warn(CFD_LOG_SOURCE, "target not found.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. search target is not found.");
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}